

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O1

size_t ZSTD_estimateSubBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,uint maxCode,size_t nbSeq,
                 FSE_CTable *fseCTable,U32 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  uint max;
  uint local_34;
  
  local_34 = maxCode;
  HIST_countFast_wksp((uint *)workspace,&local_34,codeTable,nbSeq,workspace,0x19d8);
  if (type != set_rle) {
    if (type == set_basic) {
      uVar1 = 0xffffffffffffffff;
      if (local_34 <= defaultMax) {
        uVar1 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,(uint *)workspace,local_34);
      }
      goto LAB_001be410;
    }
    if ((type & ~set_rle) == set_compressed) {
      uVar1 = ZSTD_fseBitCost(fseCTable,(uint *)workspace,local_34);
      goto LAB_001be410;
    }
  }
  uVar1 = 0;
LAB_001be410:
  if (uVar1 < 0xffffffffffffff89) {
    if (0 < (long)nbSeq) {
      pbVar4 = codeTable + nbSeq;
      do {
        uVar3 = (ulong)*codeTable;
        if (additionalBits != (U32 *)0x0) {
          uVar3 = (ulong)additionalBits[uVar3];
        }
        uVar1 = uVar1 + uVar3;
        codeTable = codeTable + 1;
      } while (codeTable < pbVar4);
    }
    sVar2 = uVar1 >> 3;
  }
  else {
    sVar2 = nbSeq * 10;
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, unsigned maxCode,
                        size_t nbSeq, const FSE_CTable* fseCTable,
                        const U32* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        cSymbolTypeSizeEstimateInBits = max <= defaultMax
                ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max)
                : ERROR(GENERIC);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) return nbSeq * 10;
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits / 8;
}